

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hungarian_algorithm.h
# Opt level: O2

duration<long,_boost::ratio<1L,_1L>_> __thiscall
hungarian_algorithm::
BruteForceSolver<boost::chrono::duration<long,boost::ratio<1l,1l>>,boost::numeric::ublas::matrix<boost::chrono::duration<long,boost::ratio<1l,1l>>,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<boost::chrono::duration<long,boost::ratio<1l,1l>>,std::allocator<boost::chrono::duration<long,boost::ratio<1l,1l>>>>>,std::greater<boost::chrono::duration<long,boost::ratio<1l,1l>>>,unsigned_long>
::getAssignment<std::vector<unsigned_long,std::allocator<unsigned_long>>>
          (BruteForceSolver<boost::chrono::duration<long,boost::ratio<1l,1l>>,boost::numeric::ublas::matrix<boost::chrono::duration<long,boost::ratio<1l,1l>>,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<boost::chrono::duration<long,boost::ratio<1l,1l>>,std::allocator<boost::chrono::duration<long,boost::ratio<1l,1l>>>>>,std::greater<boost::chrono::duration<long,boost::ratio<1l,1l>>>,unsigned_long>
           *this,vector<unsigned_long,_std::allocator<unsigned_long>_> *assignment_map)

{
  long lVar1;
  ulong uVar2;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RAX;
  size_t row;
  ulong uVar3;
  AssignmentMapAdapter<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  assignment_map_adapter;
  AssignmentMapAdapter<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_18;
  
  local_18.assignment_map_ = in_RAX;
  AssignmentMapAdapter<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::
  AssignmentMapAdapter
            (&local_18,assignment_map,*(unsigned_long *)(this + 0x18),
             *(unsigned_long *)(this + 0x20));
  lVar1 = *(long *)(this + 0x40);
  for (uVar3 = 0; uVar3 < *(ulong *)(this + 0x18); uVar3 = uVar3 + 1) {
    uVar2 = *(ulong *)(lVar1 + uVar3 * 8);
    if (uVar2 < *(ulong *)(this + 0x20)) {
      ((local_18.assignment_map_)->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
      )._M_impl.super__Vector_impl_data._M_start[uVar3] = uVar2;
    }
  }
  return (duration<long,_boost::ratio<1L,_1L>_>)*(rep *)(this + 0x88);
}

Assistant:

Cost getAssignment(AssignmentMap& assignment_map)
  {
    // Fill assignment map and compute total cost of assignment:
    AssignmentMapAdapter<Size, AssignmentMap> assignment_map_adapter(assignment_map, Size(num_rows_), Size(num_cols_));
    for (std::size_t row = 0; row < num_rows_; ++row)
    {
      const std::size_t col = optimal_assignment_[row];
      if (col < num_cols_)
      {
        assignment_map_adapter.insert(Size(row), Size(col));
      }
    }
    return optimal_cost_.second;
  }